

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_ConvolutionReverb.cpp
# Opt level: O3

int ConvolutionReverb::ProcessCallback
              (UnityAudioEffectState *state,float *inbuffer,float *outbuffer,uint length,
              int inchannels,int outchannels)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  EffectData *data;
  float *pfVar10;
  UnityComplexNumber *pUVar11;
  UnityComplexNumber **ppUVar12;
  UnityComplexNumber **ppUVar13;
  UnityComplexNumber *pUVar14;
  UnityComplexNumber *pUVar15;
  long lVar16;
  ulong uVar17;
  uint extraout_EDX;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  float *pfVar22;
  uint uVar23;
  long lVar24;
  float fVar25;
  MutexScopeLock mutexScope1;
  MutexScopeLock local_58;
  ulong local_50;
  long local_48;
  long local_40;
  Channel *local_38;
  
  data = (EffectData *)(state->field_0).field_0.effectdata;
  if (data == (EffectData *)0x0) {
    __assert_fail("effectdata",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/philips-software[P]unity-nativeaudioplugins/AudioPluginInterface.h"
                  ,0xfd,
                  "T *UnityAudioEffectState::GetEffectData() const [T = ConvolutionReverb::EffectData]"
                 );
  }
  if ((state->field_0).field_0.internal == (void *)0x0) {
    __assert_fail("internal",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/philips-software[P]unity-nativeaudioplugins/AudioPluginInterface.h"
                  ,0xfe,
                  "T *UnityAudioEffectState::GetEffectData() const [T = ConvolutionReverb::EffectData]"
                 );
  }
  fVar1 = data->p[0];
  fVar25 = powf(10.0,data->p[1] * 0.05);
  SetupImpulse(data,outchannels,length,(state->field_0).field_0.samplerate);
  local_58.mutex = data->mutex;
  Mutex::Lock(local_58.mutex);
  uVar21 = extraout_EDX;
  if (0 < inchannels) {
    local_50 = (ulong)(uint)inchannels;
    uVar17 = (ulong)(uint)data->hopsize;
    local_40 = local_50 * 4;
    local_48 = (long)outchannels << 2;
    uVar19 = 0;
    do {
      local_38 = data->channels;
      pfVar10 = local_38[uVar19].s;
      uVar6 = data->fftsize;
      uVar20 = data->writeoffset;
      uVar21 = uVar6 - 1;
      if (0 < (int)uVar17) {
        uVar17 = uVar17 & 0xffffffff;
        pfVar22 = inbuffer;
        uVar23 = uVar20;
        do {
          pfVar10[(int)uVar23] = *pfVar22;
          uVar23 = uVar23 + 1 & uVar21;
          pfVar22 = (float *)((long)pfVar22 + local_40);
          uVar17 = uVar17 - 1;
        } while (uVar17 != 0);
      }
      local_38 = local_38 + uVar19;
      pUVar11 = local_38->x[data->bufferindex];
      if (0 < (int)uVar6) {
        uVar17 = 0;
        do {
          pUVar11[uVar17].re = pfVar10[(int)uVar20];
          pUVar11[uVar17].im = 0.0;
          uVar20 = uVar20 + 1 & uVar21;
          uVar17 = uVar17 + 1;
        } while (uVar6 != uVar17);
      }
      FFT::Forward(pUVar11,uVar6,false);
      iVar7 = data->hopsize;
      pUVar11 = data->tmpoutput;
      memset(pUVar11,0,(long)data->fftsize << 3);
      lVar16 = local_48;
      iVar8 = data->numpartitions;
      uVar6 = data->fftsize;
      if (0 < (long)iVar8) {
        ppUVar12 = local_38->h;
        ppUVar13 = local_38->x;
        iVar9 = data->bufferindex;
        lVar24 = 0;
        do {
          if (0 < (int)uVar6) {
            pUVar14 = ppUVar12[lVar24];
            pUVar15 = ppUVar13[(iVar9 + (int)lVar24) % iVar8];
            uVar17 = 0;
            do {
              fVar2 = pUVar15[uVar17].re;
              fVar3 = pUVar15[uVar17].im;
              fVar4 = pUVar14[uVar17].re;
              fVar5 = pUVar14[uVar17].im;
              pUVar11[uVar17].re = (fVar4 * fVar2 + pUVar11[uVar17].re) - fVar5 * fVar3;
              pUVar11[uVar17].im = fVar4 * fVar3 + fVar5 * fVar2 + pUVar11[uVar17].im;
              uVar17 = uVar17 + 1;
            } while (uVar6 != uVar17);
          }
          lVar24 = lVar24 + 1;
        } while (lVar24 != iVar8);
      }
      FFT::Backward(pUVar11,uVar6,false);
      uVar17 = (ulong)data->hopsize;
      if (0 < (long)uVar17) {
        lVar24 = 0;
        uVar18 = 0;
        do {
          *(float *)((long)outbuffer + lVar24) =
               (pUVar11[uVar18].re * fVar25 - *(float *)((long)inbuffer + lVar24)) * fVar1 * 0.01 +
               *(float *)((long)inbuffer + lVar24);
          uVar18 = uVar18 + 1;
          lVar24 = lVar24 + lVar16;
        } while (uVar17 != uVar18);
      }
      uVar19 = uVar19 + 1;
      inbuffer = inbuffer + 1;
      outbuffer = outbuffer + 1;
    } while (uVar19 != local_50);
    uVar21 = iVar7 + uVar20 & uVar21;
  }
  iVar7 = data->bufferindex;
  data->bufferindex = iVar7 + -1;
  if (iVar7 < 1) {
    data->bufferindex = data->numpartitions + -1;
  }
  data->writeoffset = uVar21;
  MutexScopeLock::~MutexScopeLock(&local_58);
  return 0;
}

Assistant:

UNITY_AUDIODSP_RESULT UNITY_AUDIODSP_CALLBACK ProcessCallback(UnityAudioEffectState* state, float* inbuffer, float* outbuffer, unsigned int length, int inchannels, int outchannels)
    {
        EffectData* data = state->GetEffectData<EffectData>();

        const float wet = data->p[P_WET] * 0.01f;
        const float gain = powf(10.0f, 0.05f * data->p[P_GAIN]);

        // this should be done on a separate thread to avoid cpu spikes
        SetupImpulse(data, outchannels, (int)length, state->samplerate);

        // Lock data here in case float parameters are changed in pause/stopped mode and cause further calls to SetupImpulse
        MutexScopeLock mutexScope1(*data->mutex);

        int writeoffset; // set inside loop

        for (int i = 0; i < inchannels; i++)
        {
            Channel& c = data->channels[i];

            // feed new data to input buffer s
            float* s = c.s;
            const int mask = data->fftsize - 1;
            writeoffset = data->writeoffset;
            for (int n = 0; n < data->hopsize; n++)
            {
                s[writeoffset] = inbuffer[n * inchannels + i];
                writeoffset = (writeoffset + 1) & mask;
            }

            // calculate X=FFT(s)
            writeoffset = data->writeoffset;
            UnityComplexNumber* x = c.x[data->bufferindex];
            for (int n = 0; n < data->fftsize; n++)
            {
                x[n].Set(s[writeoffset], 0.0f);
                writeoffset = (writeoffset + 1) & mask;
            }
            FFT::Forward(x, data->fftsize, false);

            writeoffset = (writeoffset + data->hopsize) & mask;

            // calculate y=IFFT(sum(convolve(H_k, X_k), k=1..numpartitions))
            UnityComplexNumber* y = data->tmpoutput;
            memset(y, 0, sizeof(UnityComplexNumber) * data->fftsize);
            for (int k = 0; k < data->numpartitions; k++)
            {
                UnityComplexNumber* h = c.h[k];
                UnityComplexNumber* x = c.x[(k + data->bufferindex) % data->numpartitions];
                for (int n = 0; n < data->fftsize; n++)
                    UnityComplexNumber::MulAdd(h[n], x[n], y[n], y[n]);
            }
            FFT::Backward(y, data->fftsize, false);

            // overlap-save readout
            for (int n = 0; n < data->hopsize; n++)
            {
                float input = inbuffer[n * outchannels + i];
                outbuffer[n * outchannels + i] = input + (gain * y[n].re - input) * wet;
            }
        }

        if (--data->bufferindex < 0)
            data->bufferindex = data->numpartitions - 1;

        data->writeoffset = writeoffset;

        return UNITY_AUDIODSP_OK;
    }